

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameObservers.cpp
# Opt level: O0

void __thiscall PhaseObserver::update(PhaseObserver *this)

{
  bool bVar1;
  int iVar2;
  PlayerState PVar3;
  int iVar4;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar5;
  size_type sVar6;
  GameLoop *this_00;
  Map *this_01;
  size_type sVar7;
  ostream *poVar8;
  void *this_02;
  Hand *pHVar9;
  vector<CardType,_std::allocator<CardType>_> *pvVar10;
  difference_type dVar11;
  string local_1a8;
  reference local_188;
  Country **country_2;
  iterator __end3_2;
  iterator __begin3_2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range3_2;
  CardType *local_160;
  __normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_> local_158;
  int local_14c;
  CardType *local_148;
  __normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_> local_140;
  int local_134;
  CardType *local_130;
  __normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_> local_128;
  string local_120;
  reference local_100;
  Country **neighbour_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range4_1;
  reference local_c0;
  Country **country_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range3_1;
  reference local_80;
  Country **neighbour;
  iterator __end4;
  iterator __begin4;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range4;
  string local_50;
  reference local_30;
  Country **country;
  iterator __end3;
  iterator __begin3;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range3;
  PhaseObserver *this_local;
  
  pvVar5 = Player::getOwnedCountries(this->subject);
  sVar6 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar5);
  this_00 = GameLoop::getInstance();
  this_01 = GameLoop::getGameMap(this_00);
  pvVar5 = Map::getMapCountries(this_01);
  sVar7 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar5);
  if (sVar6 != sVar7) {
    poVar8 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<(poVar8,"#####################");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<((ostream *)&std::cout,"Player ");
    iVar2 = Player::getPlayerId(this->subject);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar2);
    poVar8 = std::operator<<(poVar8," is ");
    PVar3 = Player::getPlayerState(this->subject);
    poVar8 = operator<<(poVar8,PVar3);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<((ostream *)&std::cout,"#####################");
    this_02 = (void *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
    PVar3 = Player::getPlayerState(this->subject);
    switch(PVar3) {
    case ATTACKING:
      poVar8 = std::operator<<((ostream *)&std::cout,"You own:");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      pvVar5 = Player::getOwnedCountries(this->subject);
      __end3 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(pvVar5);
      country = (Country **)
                std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(pvVar5);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                                         *)&country), bVar1) {
        local_30 = __gnu_cxx::
                   __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                   ::operator*(&__end3);
        poVar8 = std::operator<<((ostream *)&std::cout,'\t');
        Map::Country::getCountryName_abi_cxx11_(&local_50,*local_30);
        poVar8 = std::operator<<(poVar8,(string *)&local_50);
        poVar8 = std::operator<<(poVar8,": ");
        iVar2 = Map::Country::getNumberOfTroops(*local_30);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar2);
        poVar8 = std::operator<<(poVar8," armies");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_50);
        pvVar5 = Map::Country::getAdjCountries(*local_30);
        __end4 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(pvVar5);
        neighbour = (Country **)
                    std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(pvVar5);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                                           *)&neighbour), bVar1) {
          local_80 = __gnu_cxx::
                     __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                     ::operator*(&__end4);
          iVar2 = Map::Country::getPlayerOwnerID(*local_80);
          iVar4 = Player::getPlayerId(this->subject);
          if (iVar2 != iVar4) {
            poVar8 = std::operator<<((ostream *)&std::cout,"\t\t-> ");
            Map::Country::getCountryName_abi_cxx11_((string *)&__range3_1,*local_80);
            poVar8 = std::operator<<(poVar8,(string *)&__range3_1);
            poVar8 = std::operator<<(poVar8,": owned by Player ");
            iVar2 = Map::Country::getPlayerOwnerID(*local_80);
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar2);
            poVar8 = std::operator<<(poVar8,", with ");
            iVar2 = Map::Country::getNumberOfTroops(*local_80);
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar2);
            poVar8 = std::operator<<(poVar8," armies");
            std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)&__range3_1);
          }
          __gnu_cxx::
          __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
          ::operator++(&__end4);
        }
        __gnu_cxx::
        __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
        ::operator++(&__end3);
      }
      break;
    case DEFENDING:
      break;
    case FORTIFYING:
      poVar8 = std::operator<<((ostream *)&std::cout,"You own:");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      pvVar5 = Player::getOwnedCountries(this->subject);
      __end3_1 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(pvVar5);
      country_1 = (Country **)
                  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(pvVar5);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                                 *)&country_1), bVar1) {
        local_c0 = __gnu_cxx::
                   __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                   ::operator*(&__end3_1);
        poVar8 = std::operator<<((ostream *)&std::cout,'\t');
        Map::Country::getCountryName_abi_cxx11_((string *)&__range4_1,*local_c0);
        poVar8 = std::operator<<(poVar8,(string *)&__range4_1);
        poVar8 = std::operator<<(poVar8,": ");
        iVar2 = Map::Country::getNumberOfTroops(*local_c0);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar2);
        poVar8 = std::operator<<(poVar8," armies");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&__range4_1);
        pvVar5 = Map::Country::getAdjCountries(*local_c0);
        __end4_1 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(pvVar5);
        neighbour_1 = (Country **)
                      std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(pvVar5);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4_1,
                                  (__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                                   *)&neighbour_1), bVar1) {
          local_100 = __gnu_cxx::
                      __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                      ::operator*(&__end4_1);
          iVar2 = Map::Country::getPlayerOwnerID(*local_100);
          iVar4 = Player::getPlayerId(this->subject);
          if (iVar2 == iVar4) {
            poVar8 = std::operator<<((ostream *)&std::cout,"\t\t-> ");
            Map::Country::getCountryName_abi_cxx11_(&local_120,*local_100);
            poVar8 = std::operator<<(poVar8,(string *)&local_120);
            poVar8 = std::operator<<(poVar8,": ");
            iVar2 = Map::Country::getNumberOfTroops(*local_100);
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar2);
            poVar8 = std::operator<<(poVar8," armies");
            std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)&local_120);
          }
          __gnu_cxx::
          __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
          ::operator++(&__end4_1);
        }
        __gnu_cxx::
        __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
        ::operator++(&__end3_1);
      }
      break;
    case REINFORCING:
      poVar8 = std::operator<<((ostream *)&std::cout,"Your current hand: ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      std::operator<<(poVar8,'\t');
      pHVar9 = Player::getCards(this->subject);
      pvVar10 = Hand::getHand(pHVar9);
      local_128._M_current =
           (CardType *)std::vector<CardType,_std::allocator<CardType>_>::begin(pvVar10);
      pHVar9 = Player::getCards(this->subject);
      pvVar10 = Hand::getHand(pHVar9);
      local_130 = (CardType *)std::vector<CardType,_std::allocator<CardType>_>::end(pvVar10);
      local_134 = 0;
      dVar11 = std::
               count<__gnu_cxx::__normal_iterator<CardType*,std::vector<CardType,std::allocator<CardType>>>,int>
                         (local_128,
                          (__normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_>
                           )local_130,&local_134);
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,dVar11);
      poVar8 = std::operator<<(poVar8," infantry, ");
      pHVar9 = Player::getCards(this->subject);
      pvVar10 = Hand::getHand(pHVar9);
      local_140._M_current =
           (CardType *)std::vector<CardType,_std::allocator<CardType>_>::begin(pvVar10);
      pHVar9 = Player::getCards(this->subject);
      pvVar10 = Hand::getHand(pHVar9);
      local_148 = (CardType *)std::vector<CardType,_std::allocator<CardType>_>::end(pvVar10);
      local_14c = 1;
      dVar11 = std::
               count<__gnu_cxx::__normal_iterator<CardType*,std::vector<CardType,std::allocator<CardType>>>,int>
                         (local_140,
                          (__normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_>
                           )local_148,&local_14c);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,dVar11);
      poVar8 = std::operator<<(poVar8," artillery, ");
      pHVar9 = Player::getCards(this->subject);
      pvVar10 = Hand::getHand(pHVar9);
      local_158._M_current =
           (CardType *)std::vector<CardType,_std::allocator<CardType>_>::begin(pvVar10);
      pHVar9 = Player::getCards(this->subject);
      pvVar10 = Hand::getHand(pHVar9);
      local_160 = (CardType *)std::vector<CardType,_std::allocator<CardType>_>::end(pvVar10);
      __range3_2._4_4_ = 2;
      dVar11 = std::
               count<__gnu_cxx::__normal_iterator<CardType*,std::vector<CardType,std::allocator<CardType>>>,int>
                         (local_158,
                          (__normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_>
                           )local_160,(int *)((long)&__range3_2 + 4));
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,dVar11);
      poVar8 = std::operator<<(poVar8," cavalry");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      poVar8 = std::operator<<((ostream *)&std::cout,"You own: ");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      pvVar5 = Player::getOwnedCountries(this->subject);
      __end3_2 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(pvVar5);
      country_2 = (Country **)
                  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(pvVar5);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_2,
                                (__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                                 *)&country_2), bVar1) {
        local_188 = __gnu_cxx::
                    __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                    ::operator*(&__end3_2);
        poVar8 = std::operator<<((ostream *)&std::cout,'\t');
        Map::Country::getCountryName_abi_cxx11_(&local_1a8,*local_188);
        poVar8 = std::operator<<(poVar8,(string *)&local_1a8);
        poVar8 = std::operator<<(poVar8,": ");
        iVar2 = Map::Country::getNumberOfTroops(*local_188);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar2);
        poVar8 = std::operator<<(poVar8," armies");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_1a8);
        __gnu_cxx::
        __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
        ::operator++(&__end3_2);
      }
      break;
    case IDLE:
    }
  }
  return;
}

Assistant:

void PhaseObserver::update() {

    if (this->subject->getOwnedCountries()->size() ==
        GameLoop::getInstance()->getGameMap()->getMapCountries()->size()) {
        return;
    } else {
        std::cout << std::endl << "#####################" << std::endl;
        std::cout << "Player " << this->subject->getPlayerId() << " is " << subject->getPlayerState() << std::endl;
        std::cout << "#####################" << std::endl << std::endl;

        switch (subject->getPlayerState()) {
            case ATTACKING:
                std::cout << "You own:" << std::endl;
                for (const auto& country : *subject->getOwnedCountries()) {
                    std::cout << '\t' << country->getCountryName() << ": " << country->getNumberOfTroops() << " armies"
                              << std::endl;
                    for (const auto& neighbour : *country->getAdjCountries()) {
                        if (neighbour->getPlayerOwnerID() != subject->getPlayerId()) {
                            std::cout << "\t\t-> " << neighbour->getCountryName() << ": owned by Player "
                                      << neighbour->getPlayerOwnerID() << ", with " << neighbour->getNumberOfTroops()
                                      << " armies" << std::endl;
                        }
                    }
                }
                break;
            case DEFENDING:
                break;
            case FORTIFYING:
                std::cout << "You own:" << std::endl;
                for (const auto& country : *subject->getOwnedCountries()) {
                    std::cout << '\t' << country->getCountryName() << ": " << country->getNumberOfTroops() << " armies"
                              << std::endl;
                    for (const auto& neighbour : *country->getAdjCountries()) {
                        if (neighbour->getPlayerOwnerID() == subject->getPlayerId()) {
                            std::cout << "\t\t-> " << neighbour->getCountryName() << ": "
                                      << neighbour->getNumberOfTroops()
                                      << " armies" << std::endl;
                        }
                    }
                }
                break;
            case REINFORCING:
                std::cout << "Your current hand: " << std::endl << '\t';
                std::cout
                        << std::count(subject->getCards()->getHand()->begin(), subject->getCards()->getHand()->end(), 0)
                        << " infantry, "
                        << std::count(subject->getCards()->getHand()->begin(), subject->getCards()->getHand()->end(), 1)
                        << " artillery, "
                        << std::count(subject->getCards()->getHand()->begin(), subject->getCards()->getHand()->end(), 2)
                        << " cavalry" << std::endl;
                std::cout << "You own: " << std::endl;
                for (const auto& country : *subject->getOwnedCountries()) {
                    std::cout << '\t' << country->getCountryName() << ": " << country->getNumberOfTroops() << " armies"
                              << std::endl;
                }
                break;
            case IDLE:
                break;
        }
    }
}